

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Add_Module(FT_Library library,FT_Module_Class *clazz)

{
  uint uVar1;
  char *__s2;
  FT_Memory pFVar2;
  size_t __n;
  int iVar3;
  FT_Error FVar4;
  FT_Module pFVar5;
  FT_Module_Class *pFVar6;
  ulong uVar7;
  FT_Driver driver;
  FT_UInt FVar8;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (clazz == (FT_Module_Class *)0x0) {
    return 6;
  }
  if (0x20009 < clazz->module_requires) {
    return 4;
  }
  FVar8 = library->num_modules;
  if ((ulong)FVar8 != 0) {
    __s2 = clazz->module_name;
    uVar7 = 0;
    do {
      pFVar5 = library->modules[uVar7];
      pFVar6 = pFVar5->clazz;
      iVar3 = strcmp(pFVar6->module_name,__s2);
      if (iVar3 == 0) {
        if (clazz->module_version <= pFVar6->module_version) {
          return 5;
        }
        FT_Remove_Module(library,pFVar5);
        FVar8 = library->num_modules;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (FVar8 != uVar7);
    if (0x1f < FVar8) {
      return 0x30;
    }
  }
  pFVar2 = library->memory;
  __n = clazz->module_size;
  if ((long)__n < 1) {
    if (__n != 0) {
      return 6;
    }
    pFVar5 = (FT_Module)0x0;
  }
  else {
    pFVar5 = (FT_Module)(*pFVar2->alloc)(pFVar2,__n);
    if (pFVar5 == (FT_Module)0x0) {
      return 0x40;
    }
    memset(pFVar5,0,__n);
  }
  pFVar5->library = library;
  pFVar5->memory = pFVar2;
  pFVar5->clazz = clazz;
  uVar7 = clazz->module_flags;
  pFVar6 = clazz;
  if ((uVar7 & 2) != 0) {
    FVar4 = ft_add_renderer(pFVar5);
    if (FVar4 != 0) goto LAB_00135be6;
    pFVar6 = pFVar5->clazz;
    uVar7 = pFVar6->module_flags;
  }
  if ((uVar7 & 4) != 0) {
    library->auto_hinter = pFVar5;
  }
  if ((uVar7 & 1) != 0) {
    pFVar5[1].clazz = pFVar6;
  }
  if ((clazz->module_init == (FT_Module_Constructor)0x0) ||
     (FVar4 = (*clazz->module_init)(pFVar5), FVar4 == 0)) {
    uVar1 = library->num_modules;
    library->num_modules = uVar1 + 1;
    library->modules[uVar1] = pFVar5;
    return 0;
  }
LAB_00135be6:
  if (((((pFVar5->clazz->module_flags & 2) != 0) &&
       (pFVar6 = pFVar5[1].clazz, pFVar6 != (FT_Module_Class *)0x0)) &&
      ((int)pFVar6[1].module_flags == 0x6f75746c)) && (pFVar5[4].library != (FT_Library)0x0)) {
    (**(code **)((long)pFVar6[1].module_interface + 0x28))();
  }
  (*pFVar2->free)(pFVar2,pFVar5);
  return FVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Add_Module( FT_Library              library,
                 const FT_Module_Class*  clazz )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Module  module = NULL;
    FT_UInt    nn;


#define FREETYPE_VER_FIXED  ( ( (FT_Long)FREETYPE_MAJOR << 16 ) | \
                                FREETYPE_MINOR                  )

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !clazz )
      return FT_THROW( Invalid_Argument );

    /* check FreeType version */
    if ( clazz->module_requires > FREETYPE_VER_FIXED )
      return FT_THROW( Invalid_Version );

    /* look for a module with the same name in the library's table */
    for ( nn = 0; nn < library->num_modules; nn++ )
    {
      module = library->modules[nn];
      if ( ft_strcmp( module->clazz->module_name, clazz->module_name ) == 0 )
      {
        /* this installed module has the same name, compare their versions */
        if ( clazz->module_version <= module->clazz->module_version )
          return FT_THROW( Lower_Module_Version );

        /* remove the module from our list, then exit the loop to replace */
        /* it by our new version..                                        */
        FT_Remove_Module( library, module );
        break;
      }
    }

    memory = library->memory;
    error  = FT_Err_Ok;

    if ( library->num_modules >= FT_MAX_MODULES )
    {
      error = FT_THROW( Too_Many_Drivers );
      goto Exit;
    }

    /* allocate module object */
    if ( FT_ALLOC( module, clazz->module_size ) )
      goto Exit;

    /* base initialization */
    module->library = library;
    module->memory  = memory;
    module->clazz   = (FT_Module_Class*)clazz;

    /* check whether the module is a renderer - this must be performed */
    /* before the normal module initialization                         */
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      /* add to the renderers list */
      error = ft_add_renderer( module );
      if ( error )
        goto Fail;
    }

    /* is the module a auto-hinter? */
    if ( FT_MODULE_IS_HINTER( module ) )
      library->auto_hinter = module;

    /* if the module is a font driver */
    if ( FT_MODULE_IS_DRIVER( module ) )
    {
      FT_Driver  driver = FT_DRIVER( module );


      driver->clazz = (FT_Driver_Class)module->clazz;
    }

    if ( clazz->module_init )
    {
      error = clazz->module_init( module );
      if ( error )
        goto Fail;
    }

    /* add module to the library's table */
    library->modules[library->num_modules++] = module;

  Exit:
    return error;

  Fail:
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      FT_Renderer  renderer = FT_RENDERER( module );


      if ( renderer->clazz                                          &&
           renderer->clazz->glyph_format == FT_GLYPH_FORMAT_OUTLINE &&
           renderer->raster                                         )
        renderer->clazz->raster_class->raster_done( renderer->raster );
    }

    FT_FREE( module );
    goto Exit;
  }